

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::deinit
          (TextureCubeMapArrayGenerateMipMapFilterable *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pSVar4;
  pointer pSVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  long lVar3;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x78))(0x8ca8,0);
  (**(code **)(lVar3 + 0xb8))(0x9009,0);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  pSVar4 = (this->m_storage_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar5 = (this->m_storage_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar4) {
    uVar7 = 0;
    uVar6 = 1;
    do {
      if (pSVar4[uVar7].m_to_id != 0) {
        (**(code **)(lVar3 + 0x480))(1,&pSVar4[uVar7].m_to_id);
        pSVar4 = (this->m_storage_configs).
                 super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar4[uVar7].m_to_id = 0;
        pSVar5 = (this->m_storage_configs).
                 super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = ((long)pSVar5 - (long)pSVar4 >> 2) * -0x3333333333333333;
      bVar8 = uVar6 <= uVar7;
      lVar1 = uVar7 - uVar6;
      uVar7 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar8 && lVar1 != 0);
  }
  if (this->m_reference_data_ptr != (uchar *)0x0) {
    operator_delete__(this->m_reference_data_ptr);
    this->m_reference_data_ptr = (uchar *)0x0;
  }
  if (this->m_rendered_data_ptr != (uchar *)0x0) {
    operator_delete__(this->m_rendered_data_ptr);
    this->m_rendered_data_ptr = (uchar *)0x0;
  }
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  (**(code **)(lVar3 + 0xff0))(0xcf5,4);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset texture and FBO bindings */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Release any ES objects that may have been created. */
	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	for (unsigned int i = 0; i < m_storage_configs.size(); ++i)
	{
		if (m_storage_configs[i].m_to_id != 0)
		{
			gl.deleteTextures(1, &m_storage_configs[i].m_to_id);

			m_storage_configs[i].m_to_id = 0;
		}
	}

	/* Release buffers the test may have allocated */
	if (m_reference_data_ptr != DE_NULL)
	{
		delete[] m_reference_data_ptr;

		m_reference_data_ptr = DE_NULL;
	}

	if (m_rendered_data_ptr != DE_NULL)
	{
		delete[] m_rendered_data_ptr;

		m_rendered_data_ptr = DE_NULL;
	}

	/* Restore pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Call base class' deinitialization routine. */
	TestCaseBase::deinit();
}